

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O0

void dumpFunction(DumpState *D,Proto *f,TString *psource)

{
  TString *psource_local;
  Proto *f_local;
  DumpState *D_local;
  
  if ((D->strip == 0) && (f->source != psource)) {
    dumpString(D,f->source);
  }
  else {
    dumpString(D,(TString *)0x0);
  }
  dumpInt(D,f->linedefined);
  dumpInt(D,f->lastlinedefined);
  dumpByte(D,(uint)f->numparams);
  dumpByte(D,(uint)f->is_vararg);
  dumpByte(D,(uint)f->maxstacksize);
  dumpCode(D,f);
  dumpConstants(D,f);
  dumpUpvalues(D,f);
  dumpProtos(D,f);
  dumpDebug(D,f);
  return;
}

Assistant:

static void dumpFunction (DumpState *D, const Proto *f, TString *psource) {
  if (D->strip || f->source == psource)
    dumpString(D, NULL);  /* no debug info or same source as its parent */
  else
    dumpString(D, f->source);
  dumpInt(D, f->linedefined);
  dumpInt(D, f->lastlinedefined);
  dumpByte(D, f->numparams);
  dumpByte(D, f->is_vararg);
  dumpByte(D, f->maxstacksize);
  dumpCode(D, f);
  dumpConstants(D, f);
  dumpUpvalues(D, f);
  dumpProtos(D, f);
  dumpDebug(D, f);
}